

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5ExprFold(sqlite3_context *pCtx,int nArg,sqlite3_value **apVal)

{
  Mem *pMem;
  int iVar1;
  i64 iVar2;
  i64 iVar3;
  
  if (nArg - 3U < 0xfffffffe) {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"wrong number of arguments to function fts5_fold",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  iVar2 = sqlite3VdbeIntValue(*apVal);
  iVar1 = 0;
  if (nArg == 2) {
    iVar3 = sqlite3VdbeIntValue(apVal[1]);
    iVar1 = (int)iVar3;
  }
  iVar1 = sqlite3Fts5UnicodeFold((int)iVar2,iVar1);
  pMem = pCtx->pOut;
  if ((pMem->flags & 0x2400) != 0) {
    vdbeReleaseAndSetInt64(pMem,(long)iVar1);
    return;
  }
  (pMem->u).i = (long)iVar1;
  pMem->flags = 4;
  return;
}

Assistant:

static void fts5ExprFold(
  sqlite3_context *pCtx,          /* Function call context */
  int nArg,                       /* Number of args */
  sqlite3_value **apVal           /* Function arguments */
){
  if( nArg!=1 && nArg!=2 ){
    sqlite3_result_error(pCtx, 
        "wrong number of arguments to function fts5_fold", -1
    );
  }else{
    int iCode;
    int bRemoveDiacritics = 0;
    iCode = sqlite3_value_int(apVal[0]);
    if( nArg==2 ) bRemoveDiacritics = sqlite3_value_int(apVal[1]);
    sqlite3_result_int(pCtx, sqlite3Fts5UnicodeFold(iCode, bRemoveDiacritics));
  }
}